

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapSort.c
# Opt level: O1

void HeapSort(int *sort,int length)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)length;
  if (1 < length) {
    iVar2 = ((uint)length >> 1) + 1;
    do {
      HeapAdjust(sort,iVar2 + -2,length);
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  if (0 < length) {
    do {
      iVar2 = sort[uVar3 - 1];
      sort[uVar3 - 1] = *sort;
      *sort = iVar2;
      HeapAdjust(sort,0,(int)(uVar3 - 1));
      bVar1 = 1 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void HeapSort(int sort[], int length)
{
    // 初始化堆
    // length / 2 - 1是二叉树中最后一个非叶子结点的序号
    for (int i = length / 2 - 1; i >= 0; i--)
    {
        HeapAdjust(sort, i, length);
    }
    // 交换堆顶元素和最后一个元素
    for (int i = length - 1; i >= 0; i--)
    {
        int temp;
        temp = sort[i];
        sort[i] = sort[0];
        sort[0] = temp;
        HeapAdjust(sort, 0, i);
    }
}